

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

void Assimp::Subdivide(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  pointer *ppaVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  iterator iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  aiVector3D c;
  aiVector3D b;
  aiVector3D a;
  aiVector3t<float> local_b8;
  aiVector3t<float> local_a8;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  uint local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  paVar4 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  fVar10 = paVar4->z * paVar4->z + paVar4->x * paVar4->x + paVar4->y * paVar4->y;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  local_5c = (int)((ulong)((long)(positions->
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(positions->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  if (local_5c != 0) {
    uVar9 = 0;
    do {
      iVar8 = (int)uVar9;
      paVar4 = (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = iVar8 + 1;
      uVar7 = iVar8 + 2;
      local_98.z = paVar4[uVar9].z;
      local_98.x = paVar4[uVar9].x;
      local_98.y = paVar4[uVar9].y;
      local_a8.z = paVar4[uVar6].z;
      local_a8.x = paVar4[uVar6].x;
      local_a8.y = paVar4[uVar6].y;
      local_b8.z = paVar4[uVar7].z;
      local_b8.x = paVar4[uVar7].x;
      local_b8.y = paVar4[uVar7].y;
      fVar12 = local_98.x + local_a8.x;
      fVar14 = local_98.y + local_a8.y;
      fVar13 = local_98.z + local_a8.z;
      fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar14 * fVar14;
      if (fVar11 < 0.0) {
        local_48 = ZEXT416((uint)fVar12);
        local_58 = ZEXT416((uint)fVar14);
        fVar11 = sqrtf(fVar11);
        fVar12 = (float)local_48._0_4_;
        fVar14 = (float)local_58._0_4_;
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = 1.0 / fVar11;
      local_68.z = fVar13 * fVar11 * fVar10;
      local_68.y = fVar14 * fVar11 * fVar10;
      local_68.x = fVar12 * fVar11 * fVar10;
      fVar12 = local_98.x + local_b8.x;
      fVar14 = local_98.y + local_b8.y;
      fVar13 = local_98.z + local_b8.z;
      fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar14 * fVar14;
      if (fVar11 < 0.0) {
        local_48 = ZEXT416((uint)fVar12);
        local_58 = ZEXT416((uint)fVar14);
        fVar11 = sqrtf(fVar11);
        fVar12 = (float)local_48._0_4_;
        fVar14 = (float)local_58._0_4_;
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = 1.0 / fVar11;
      local_78.z = fVar13 * fVar11 * fVar10;
      local_78.y = fVar14 * fVar11 * fVar10;
      local_78.x = fVar12 * fVar11 * fVar10;
      fVar12 = local_a8.x + local_b8.x;
      fVar14 = local_a8.y + local_b8.y;
      fVar13 = local_a8.z + local_b8.z;
      fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar14 * fVar14;
      if (fVar11 < 0.0) {
        local_48 = ZEXT416((uint)fVar12);
        local_58 = ZEXT416((uint)fVar14);
        fVar11 = sqrtf(fVar11);
        fVar12 = (float)local_48._0_4_;
        fVar14 = (float)local_58._0_4_;
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      paVar2 = paVar4 + uVar9;
      paVar3 = paVar4 + uVar6;
      paVar4 = paVar4 + uVar7;
      fVar11 = 1.0 / fVar11;
      fVar12 = fVar12 * fVar11 * fVar10;
      fVar14 = fVar14 * fVar11 * fVar10;
      local_88.z = fVar13 * fVar11 * fVar10;
      local_88.y = fVar14;
      local_88.x = fVar12;
      paVar2->z = local_68.z;
      paVar2->x = local_68.x;
      paVar2->y = local_68.y;
      paVar3->z = local_88.z;
      paVar3->x = fVar12;
      paVar3->y = fVar14;
      paVar4->z = local_78.z;
      paVar4->x = local_78.x;
      paVar4->y = local_78.y;
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_68);
      }
      else {
        (iVar5._M_current)->z = local_68.z;
        (iVar5._M_current)->x = local_68.x;
        (iVar5._M_current)->y = local_68.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_78);
      }
      else {
        (iVar5._M_current)->z = local_78.z;
        (iVar5._M_current)->x = local_78.x;
        (iVar5._M_current)->y = local_78.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_98);
      }
      else {
        (iVar5._M_current)->z = local_98.z;
        (iVar5._M_current)->x = local_98.x;
        (iVar5._M_current)->y = local_98.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_78);
      }
      else {
        (iVar5._M_current)->z = local_78.z;
        (iVar5._M_current)->x = local_78.x;
        (iVar5._M_current)->y = local_78.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_88);
      }
      else {
        (iVar5._M_current)->z = local_88.z;
        (iVar5._M_current)->x = local_88.x;
        (iVar5._M_current)->y = local_88.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_b8);
      }
      else {
        (iVar5._M_current)->z = local_b8.z;
        (iVar5._M_current)->x = local_b8.x;
        (iVar5._M_current)->y = local_b8.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_88);
      }
      else {
        (iVar5._M_current)->z = local_88.z;
        (iVar5._M_current)->x = local_88.x;
        (iVar5._M_current)->y = local_88.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_68);
      }
      else {
        (iVar5._M_current)->z = local_68.z;
        (iVar5._M_current)->x = local_68.x;
        (iVar5._M_current)->y = local_68.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      iVar5._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar5,
                   &local_a8);
      }
      else {
        (iVar5._M_current)->z = local_a8.z;
        (iVar5._M_current)->x = local_a8.x;
        (iVar5._M_current)->y = local_a8.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      uVar9 = (ulong)(iVar8 + 3U);
    } while (iVar8 + 3U < local_5c);
  }
  return;
}

Assistant:

void Subdivide(std::vector<aiVector3D>& positions)
{
    // assume this to be constant - (fixme: must be 1.0? I think so)
    const ai_real fl1 = positions[0].Length();

    unsigned int origSize = (unsigned int)positions.size();
    for (unsigned int i = 0 ; i < origSize ; i+=3)
    {
        aiVector3D& tv0 = positions[i];
        aiVector3D& tv1 = positions[i+1];
        aiVector3D& tv2 = positions[i+2];

        aiVector3D a = tv0, b = tv1, c = tv2;
        aiVector3D v1 = aiVector3D(a.x+b.x, a.y+b.y, a.z+b.z).Normalize()*fl1;
        aiVector3D v2 = aiVector3D(a.x+c.x, a.y+c.y, a.z+c.z).Normalize()*fl1;
        aiVector3D v3 = aiVector3D(b.x+c.x, b.y+c.y, b.z+c.z).Normalize()*fl1;

        tv0 = v1; tv1 = v3; tv2 = v2; // overwrite the original
        ADD_TRIANGLE(v1, v2, a);
        ADD_TRIANGLE(v2, v3, c);
        ADD_TRIANGLE(v3, v1, b);
    }
}